

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::EditingIterator::
RemoveCurrent(EditingIterator *this,HeapAllocator *allocator)

{
  NodeBase *buffer;
  
  buffer = (this->super_Iterator).current;
  UnlinkCurrentNode(this);
  Memory::HeapAllocator::Free(allocator,buffer,0x20);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            const NodeBase *dead = this->current;
            UnlinkCurrent();

            auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();

            AllocatorFree(allocator, freeFunc, (Node *) dead, sizeof(Node));
        }